

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O3

IfcMatrix4 *
Assimp::IFC::ProjectOntoPlane
          (IfcMatrix4 *__return_storage_ptr__,
          vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *out_contour,
          TempMesh *in_mesh,bool *ok,IfcVector3 *nor_out)

{
  pointer *ppaVar1;
  double dVar2;
  iterator __position;
  pointer paVar3;
  IfcVector2 *vv;
  long lVar4;
  pointer paVar5;
  long lVar6;
  pointer paVar7;
  pointer paVar8;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *__range2_1;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *__range2;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  aiVector2t<double> aVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> out_contour2;
  double local_218;
  double local_188;
  IfcMatrix3 local_178;
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  aiVector2t<double> local_98;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  *ok = true;
  DerivePlaneCoordinateSpace(&local_178,in_mesh,ok,nor_out);
  dVar9 = local_178.a2;
  if (*ok == false) {
    __return_storage_ptr__->a1 = 1.0;
    __return_storage_ptr__->a2 = 0.0;
    __return_storage_ptr__->a3 = 0.0;
    __return_storage_ptr__->a4 = 0.0;
    __return_storage_ptr__->b1 = 0.0;
    __return_storage_ptr__->b2 = 1.0;
    __return_storage_ptr__->b3 = 0.0;
    __return_storage_ptr__->b4 = 0.0;
    __return_storage_ptr__->c1 = 0.0;
    __return_storage_ptr__->c2 = 0.0;
    __return_storage_ptr__->c3 = 1.0;
    __return_storage_ptr__->c4 = 0.0;
    __return_storage_ptr__->d1 = 0.0;
    __return_storage_ptr__->d2 = 0.0;
    __return_storage_ptr__->d3 = 0.0;
    __return_storage_ptr__->d4 = 1.0;
  }
  else {
    local_a8 = local_178.a1;
    uStack_a0 = 0;
    local_58 = local_178.b3;
    dStack_50 = local_178.b3;
    local_68 = local_178.a3;
    dStack_60 = local_178.a3;
    local_b8 = local_178.b1;
    uStack_b0 = 0;
    local_88 = local_178.b1 * 0.0;
    uStack_80 = 0;
    local_c8 = local_178.b2;
    dStack_c0 = local_178.b3;
    local_78 = local_178.b2 * 0.0;
    dStack_70 = local_178.b3 * 0.0;
    local_218 = 0.0;
    if (1e-05 <= ABS(dStack_70 * local_178.c2 * 0.0 +
                     local_178.c1 * dStack_70 * -0.0 +
                     local_78 * local_178.c1 * 0.0 +
                     local_178.c3 * local_78 * -0.0 +
                     local_88 * local_178.c3 * 0.0 +
                     local_178.c2 * local_88 * -0.0 +
                     ((local_178.a3 * local_178.b2 * 0.0 * 0.0 +
                      local_178.a3 * local_178.b1 * -0.0 * 0.0 +
                      local_178.a3 * local_178.b1 * local_178.c2 +
                      local_178.c2 * local_178.a3 * 0.0 * -0.0 +
                      local_178.a3 * 0.0 * local_178.c1 * 0.0 +
                      local_178.a2 * local_178.b1 * 0.0 * 0.0 +
                      ((local_178.a2 * 0.0 * local_178.c3 * 0.0 +
                       local_178.c1 * local_178.a2 * 0.0 * -0.0 +
                       local_178.a2 * local_178.b3 * local_178.c1 +
                       local_178.a2 * local_178.b3 * -0.0 * 0.0 +
                       local_178.c3 * local_178.a1 * 0.0 * -0.0 +
                       local_178.a1 * 0.0 * local_178.c2 * 0.0 +
                       ((local_178.a1 * local_178.b3 * 0.0 * 0.0 +
                        local_178.a1 * local_178.b2 * -0.0 * 0.0 +
                        local_178.a1 * local_178.b2 * local_178.c3) -
                       local_178.a1 * local_178.b3 * local_178.c2)) -
                      local_178.a2 * local_178.b1 * local_178.c3)) -
                     local_178.a3 * local_178.b2 * local_178.c1) + -1.0)) {
      __assert_fail("std::fabs(det-1) < 1e-5",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/IFC/IFCOpenings.cpp"
                    ,0x42e,
                    "IfcMatrix4 Assimp::IFC::ProjectOntoPlane(std::vector<IfcVector2> &, const TempMesh &, bool &, IfcVector3 &)"
                   );
    }
    std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::reserve
              (out_contour,
               ((long)(in_mesh->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(in_mesh->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    paVar7 = (in_mesh->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    paVar8 = (in_mesh->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (paVar7 == paVar8) {
      dVar10 = 10000000000.0;
      dVar11 = 10000000000.0;
      dVar24 = -10000000000.0;
      dVar16 = -10000000000.0;
      local_188 = -20000000000.0;
      paVar8 = paVar7;
    }
    else {
      dVar10 = 10000000000.0;
      dVar11 = 10000000000.0;
      dVar24 = -10000000000.0;
      dVar16 = -10000000000.0;
      dVar25 = -10000000000.0;
      dVar23 = 10000000000.0;
      local_218 = 0.0;
      local_118 = local_178.a3;
      dStack_110 = dStack_c0;
      local_128 = local_a8;
      dStack_120 = local_b8;
      local_48 = local_178.a2;
      dStack_40 = local_c8;
      dVar14 = local_178.a3;
      dVar26 = dStack_c0;
      dVar27 = local_a8;
      dVar19 = local_b8;
      dVar20 = local_c8;
      do {
        dVar15 = paVar7->x;
        dVar21 = paVar7->y;
        dVar2 = paVar7->z;
        dVar28 = dVar2 * dVar14 + dVar15 * dVar27 + dVar21 * local_178.a2;
        dVar29 = dVar2 * dVar26 + dVar15 * dVar19 + dVar21 * dVar20;
        local_178.a1 = dVar28 + 0.0;
        dStack_d0 = dVar29 + 0.0;
        __position._M_current =
             (out_contour->
             super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        local_d8 = local_178.a1;
        if (__position._M_current ==
            (out_contour->
            super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          dStack_100 = 0.0;
          local_178.a2 = dStack_d0;
          local_108 = dVar21;
          local_f8 = dVar24;
          dStack_f0 = dVar16;
          local_e8 = dVar10;
          dStack_e0 = dVar11;
          std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
          _M_realloc_insert<aiVector2t<double>>
                    ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)out_contour,
                     __position,(aiVector2t<double> *)&local_178);
          dVar14 = local_118;
          dVar26 = dStack_110;
          dVar27 = local_128;
          dVar19 = dStack_120;
          local_178.a2 = local_48;
          dVar20 = dStack_40;
          dVar21 = local_108;
          dVar10 = local_e8;
          dVar11 = dStack_e0;
          dVar24 = local_f8;
          dVar16 = dStack_f0;
        }
        else {
          (__position._M_current)->x = local_178.a1;
          (__position._M_current)->y = dStack_d0;
          ppaVar1 = &(out_contour->
                     super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
        }
        dVar21 = dVar2 * local_178.c3 + dVar15 * local_178.c1 + dVar21 * local_178.c2;
        dVar15 = dVar21 + 0.0;
        local_218 = local_218 + dVar15;
        dVar23 = (double)(-(ulong)(dVar23 < dVar21) & (ulong)dVar23 |
                         ~-(ulong)(dVar23 < dVar21) & (ulong)dVar15);
        dVar10 = (double)(~-(ulong)(dVar10 < dVar28) & (ulong)local_d8 |
                         (ulong)dVar10 & -(ulong)(dVar10 < dVar28));
        dVar11 = (double)(~-(ulong)(dVar11 < dVar29) & (ulong)dStack_d0 |
                         (ulong)dVar11 & -(ulong)(dVar11 < dVar29));
        dVar24 = (double)(~-(ulong)(dVar28 < dVar24) & (ulong)local_d8 |
                         (ulong)dVar24 & -(ulong)(dVar28 < dVar24));
        dVar16 = (double)(~-(ulong)(dVar29 < dVar16) & (ulong)dStack_d0 |
                         (ulong)dVar16 & -(ulong)(dVar29 < dVar16));
        dVar25 = (double)(-(ulong)(dVar21 < dVar25) & (ulong)dVar25 |
                         ~-(ulong)(dVar21 < dVar25) & (ulong)dVar15);
        paVar7 = paVar7 + 1;
      } while (paVar7 != paVar8);
      paVar7 = (in_mesh->mVerts).
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_188 = (dVar25 - dVar23) + 1e-08;
      paVar8 = (in_mesh->mVerts).
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    auVar13 = _DAT_006b79d0;
    lVar4 = ((long)paVar7 - (long)paVar8 >> 3) * -0x5555555555555555;
    auVar12._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar12._0_8_ = lVar4;
    auVar12._12_4_ = 0x45300000;
    auVar22._0_8_ = dVar24 - dVar10;
    auVar22._8_8_ = dVar16 - dVar11;
    paVar5 = (out_contour->
             super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
             super__Vector_impl_data._M_start;
    paVar3 = (out_contour->
             super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (paVar5 != paVar3) {
      do {
        auVar17._0_8_ = paVar5->x - dVar10;
        auVar17._8_8_ = paVar5->y - dVar11;
        auVar17 = divpd(auVar17,auVar22);
        auVar17 = maxpd(ZEXT816(0),auVar17);
        aVar18 = (aiVector2t<double>)minpd(auVar13,auVar17);
        *paVar5 = aVar18;
        paVar5 = paVar5 + 1;
      } while (paVar5 != paVar3);
      paVar8 = (in_mesh->mVerts).
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      paVar7 = (in_mesh->mVerts).
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    auVar13 = divpd(_DAT_006b79d0,auVar22);
    dVar21 = -local_218 /
             ((auVar12._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
    dVar24 = auVar13._0_8_;
    dVar16 = auVar13._8_8_;
    dVar15 = local_a8 * 0.0 + local_88;
    dVar23 = dVar9 * 0.0 + local_78;
    dVar25 = local_178.a3 * 0.0 + dStack_70;
    dVar26 = -dVar10 * dVar24;
    dVar27 = -dVar11 * dVar16;
    local_118 = dVar26 * 0.0 + dVar24 * local_a8 + local_88 + local_178.c1 * 0.0;
    dVar19 = dVar26 * 0.0 + dVar24 * dVar9 + local_78 + local_178.c2 * 0.0;
    local_128 = dVar27 * 0.0 + local_a8 * 0.0 + local_b8 * dVar16 + local_178.c1 * 0.0;
    dVar20 = dVar27 * 0.0 + dVar9 * 0.0 + local_c8 * dVar16 + local_178.c2 * 0.0;
    dVar9 = dVar26 * 0.0 + local_178.c3 * 0.0 + local_68 * dVar24 + dStack_70;
    dVar14 = dVar27 * 0.0 + local_178.c3 * 0.0 + dStack_60 * 0.0 + local_58 * dVar16;
    dVar26 = dVar24 * 0.0 + 0.0 + 0.0 + dVar26;
    dVar27 = dVar16 * 0.0 + 0.0 + dVar27;
    dVar10 = dVar21 * 0.0;
    dVar24 = dVar25 + local_178.c3 + dVar10;
    dVar11 = dVar10 + dVar15 + local_178.c1;
    dVar10 = dVar10 + dVar23 + local_178.c2;
    dVar21 = dVar21 + 0.0;
    local_178.a1 = 0.0;
    local_178.a2 = 0.0;
    local_178.a3 = 0.0;
    dStack_120 = dVar20;
    dStack_110 = dVar19;
    if (paVar8 != paVar7) {
      local_108 = local_118;
      dStack_100 = local_128;
      do {
        local_e8 = paVar8->x;
        local_f8 = paVar8->y;
        local_d8 = paVar8->z;
        dStack_f0 = 0.0;
        dStack_e0 = 0.0;
        dStack_d0 = 0.0;
        local_98.x = local_d8 * dVar9 + local_e8 * local_108 + local_f8 * dVar19 + dVar26;
        local_98.y = local_d8 * dVar14 + local_e8 * dStack_100 + local_f8 * dVar20 + dVar27;
        if (local_178.a2 == local_178.a3) {
          std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
          _M_realloc_insert<aiVector2t<double>>
                    ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)&local_178,
                     (iterator)local_178.a2,&local_98);
        }
        else {
          *(double *)local_178.a2 = local_98.x;
          *(double *)((long)local_178.a2 + 8) = local_98.y;
          local_178.a2 = (double)((long)local_178.a2 + 0x10);
        }
        if (local_188 <= ABS(local_d8 * dVar24 + local_e8 * dVar11 + local_f8 * dVar10 + dVar21)) {
          __assert_fail("std::fabs(vv.z) < vmax.z + 1e-8",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/IFC/IFCOpenings.cpp"
                        ,0x46a,
                        "IfcMatrix4 Assimp::IFC::ProjectOntoPlane(std::vector<IfcVector2> &, const TempMesh &, bool &, IfcVector3 &)"
                       );
        }
        paVar8 = paVar8 + 1;
      } while (paVar8 != paVar7);
    }
    paVar5 = (out_contour->
             super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = (long)(out_contour->
                  super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)paVar5;
    if (lVar4 != 0) {
      lVar4 = lVar4 >> 4;
      lVar4 = lVar4 + (ulong)(lVar4 == 0);
      lVar6 = 8;
      do {
        dVar16 = *(double *)((long)paVar5 + lVar6 + -8) -
                 *(double *)((long)local_178.a1 + lVar6 + -8);
        dVar19 = *(double *)((long)&paVar5->x + lVar6) - *(double *)((long)local_178.a1 + lVar6);
        if (1e-06 <= dVar16 * dVar16 + dVar19 * dVar19) {
          __assert_fail("(out_contour[i]-out_contour2[i]).SquareLength() < 1e-6",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/IFC/IFCOpenings.cpp"
                        ,0x46e,
                        "IfcMatrix4 Assimp::IFC::ProjectOntoPlane(std::vector<IfcVector2> &, const TempMesh &, bool &, IfcVector3 &)"
                       );
        }
        lVar6 = lVar6 + 0x10;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
    __return_storage_ptr__->a1 = local_118;
    __return_storage_ptr__->a2 = dStack_110;
    __return_storage_ptr__->a3 = dVar9;
    __return_storage_ptr__->a4 = dVar26;
    __return_storage_ptr__->b1 = local_128;
    __return_storage_ptr__->b2 = dStack_120;
    __return_storage_ptr__->b3 = dVar14;
    __return_storage_ptr__->b4 = dVar27;
    __return_storage_ptr__->c1 = dVar11;
    __return_storage_ptr__->c2 = dVar10;
    __return_storage_ptr__->c3 = dVar24;
    __return_storage_ptr__->c4 = dVar21;
    __return_storage_ptr__->d1 = local_178.c1 * 0.0 + dVar15 + 0.0;
    __return_storage_ptr__->d2 = local_178.c2 * 0.0 + dVar23 + 0.0;
    __return_storage_ptr__->d3 = local_178.c3 * 0.0 + dVar25 + 0.0;
    __return_storage_ptr__->d4 = 1.0;
    if ((void *)local_178.a1 != (void *)0x0) {
      operator_delete((void *)local_178.a1,(long)local_178.a3 - (long)local_178.a1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IfcMatrix4 ProjectOntoPlane(std::vector<IfcVector2>& out_contour, const TempMesh& in_mesh,
    bool &ok, IfcVector3& nor_out)
{
    const std::vector<IfcVector3>& in_verts = in_mesh.mVerts;
    ok = true;

    IfcMatrix4 m = IfcMatrix4(DerivePlaneCoordinateSpace(in_mesh, ok, nor_out));
    if(!ok) {
        return IfcMatrix4();
    }
#ifdef ASSIMP_BUILD_DEBUG
    const IfcFloat det = m.Determinant();
    ai_assert(std::fabs(det-1) < 1e-5);
#endif

    IfcFloat zcoord = 0;
    out_contour.reserve(in_verts.size());


    IfcVector3 vmin, vmax;
    MinMaxChooser<IfcVector3>()(vmin, vmax);

    // Project all points into the new coordinate system, collect min/max verts on the way
    for(const IfcVector3& x : in_verts) {
        const IfcVector3 vv = m * x;
        // keep Z offset in the plane coordinate system. Ignoring precision issues
        // (which  are present, of course), this should be the same value for
        // all polygon vertices (assuming the polygon is planar).

        // XXX this should be guarded, but we somehow need to pick a suitable
        // epsilon
        // if(coord != -1.0f) {
        //  assert(std::fabs(coord - vv.z) < 1e-3f);
        // }
        zcoord += vv.z;
        vmin = std::min(vv, vmin);
        vmax = std::max(vv, vmax);

        out_contour.push_back(IfcVector2(vv.x,vv.y));
    }

    zcoord /= in_verts.size();

    // Further improve the projection by mapping the entire working set into
    // [0,1] range. This gives us a consistent data range so all epsilons
    // used below can be constants.
    vmax -= vmin;
    for(IfcVector2& vv : out_contour) {
        vv.x  = (vv.x - vmin.x) / vmax.x;
        vv.y  = (vv.y - vmin.y) / vmax.y;

        // sanity rounding
        vv = std::max(vv,IfcVector2());
        vv = std::min(vv,one_vec);
    }

    IfcMatrix4 mult;
    mult.a1 = static_cast<IfcFloat>(1.0) / vmax.x;
    mult.b2 = static_cast<IfcFloat>(1.0) / vmax.y;

    mult.a4 = -vmin.x * mult.a1;
    mult.b4 = -vmin.y * mult.b2;
    mult.c4 = -zcoord;
    m = mult * m;

    // debug code to verify correctness
#ifdef ASSIMP_BUILD_DEBUG
    std::vector<IfcVector2> out_contour2;
    for(const IfcVector3& x : in_verts) {
        const IfcVector3& vv = m * x;

        out_contour2.push_back(IfcVector2(vv.x,vv.y));
        ai_assert(std::fabs(vv.z) < vmax.z + 1e-8);
    }

    for(size_t i = 0; i < out_contour.size(); ++i) {
        ai_assert((out_contour[i]-out_contour2[i]).SquareLength() < 1e-6);
    }
#endif

    return m;
}